

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O1

void __thiscall rest_rpc::rpc_client::async_connect(rpc_client *this)

{
  char *str;
  undefined1 *puVar1;
  undefined8 *puVar2;
  error_code __ec;
  bad_address_cast ex;
  address addr;
  data_union local_68;
  error_code local_48;
  address local_34;
  
  str = (this->host_)._M_dataplus._M_p;
  local_48._0_8_ = local_48._0_8_ & 0xffffffff00000000;
  local_48._M_cat = (error_category *)std::_V2::system_category();
  asio::ip::make_address(&local_34,str,&local_48);
  __ec._0_8_ = local_48._0_8_ & 0xffffffff;
  if (local_48._M_value != 0) {
    __ec._M_cat = local_48._M_cat;
    std::system_error::system_error((system_error *)&local_68,__ec);
    asio::detail::throw_exception<std::system_error>((system_error *)&local_68);
    std::system_error::~system_error((system_error *)&local_68);
  }
  local_68._16_4_ = 0;
  local_68._20_4_ = 0;
  local_68.v6.sin6_scope_id = 0;
  local_68._8_4_ = 0;
  local_68._12_4_ = 0;
  local_68.v4.sin_port = this->port_ << 8 | this->port_ >> 8;
  if (local_34.type_ == ipv4) {
    puVar1 = (undefined1 *)((long)&local_68.v4 + 4);
    local_68.base.sa_family = 2;
    local_68.v6.sin6_flowinfo = 0;
    local_34.ipv6_address_.scope_id_ = (scope_id_type)local_34.ipv4_address_.addr_.s_addr;
  }
  else {
    local_68.base.sa_family = 10;
    local_68.v6.sin6_flowinfo = 0;
    if (local_34.type_ != ipv6) {
      local_48._0_8_ = &PTR__bad_cast_001b7ea0;
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = &PTR__bad_cast_001b7ea0;
      __cxa_throw(puVar2,&asio::ip::bad_address_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    puVar1 = (undefined1 *)((long)&local_68 + 0x18);
    local_68._8_4_ = (undefined4)local_34.ipv6_address_.addr_.__in6_u._0_8_;
    local_68._12_4_ = (undefined4)((ulong)local_34.ipv6_address_.addr_.__in6_u._0_8_ >> 0x20);
    local_68._16_4_ = (undefined4)local_34.ipv6_address_.addr_.__in6_u._8_8_;
    local_68._20_4_ = (undefined4)((ulong)local_34.ipv6_address_.addr_.__in6_u._8_8_ >> 0x20);
  }
  *(scope_id_type *)puVar1 = local_34.ipv6_address_.scope_id_;
  local_48._0_8_ = this;
  asio::basic_socket<asio::ip::tcp,asio::any_io_executor>::
  async_connect<rest_rpc::rpc_client::async_connect()::_lambda(std::error_code_const&)_1_>
            ((basic_socket<asio::ip::tcp,asio::any_io_executor> *)&this->socket_,
             (endpoint_type *)&local_68,(anon_class_8_1_8991fb9c *)&local_48);
  return;
}

Assistant:

void async_connect() {
    assert(port_ != 0);
    auto addr = asio::ip::address::from_string(host_);
    socket_.async_connect({addr, port_}, [this](const asio::error_code &ec) {
      if (has_connected_ || stop_client_) {
        return;
      }

      if (ec) {
        // std::cout << ec.message() << std::endl;

        has_connected_ = false;

        if (reconnect_cnt_ <= 0) {
          return;
        }

        if (reconnect_cnt_ > 0) {
          reconnect_cnt_--;
        }

        async_reconnect();
      } else {
        // std::cout<<"connected ok"<<std::endl;
        if (is_ssl()) {
          handshake();
          return;
        }

        has_connected_ = true;
        do_read();
        resend_subscribe();
        if (has_wait_)
          conn_cond_.notify_one();
      }
    });
  }